

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

int32_t ucnv_convertAlgorithmic
                  (UBool convertToAlgorithmic,UConverterType algorithmicType,UConverter *cnv,
                  char *target,int32_t targetCapacity,char *source,int32_t sourceLength,
                  UErrorCode *pErrorCode)

{
  UConverter *converter;
  UConverter *outConverter;
  int32_t iVar1;
  UConverter algoConverterStatic;
  UConverter local_150;
  
  iVar1 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar1 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (((targetCapacity < 0) ||
        (((cnv == (UConverter *)0x0 || (source == (char *)0x0)) || (sourceLength < -1)))) ||
       (target == (char *)0x0 && targetCapacity != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if ((sourceLength == 0) || ((sourceLength < 0 && (*source == '\0')))) {
        iVar1 = u_terminateChars_63(target,targetCapacity,0,pErrorCode);
        return iVar1;
      }
      iVar1 = 0;
      converter = ucnv_createAlgorithmicConverter_63(&local_150,algorithmicType,"",0,pErrorCode);
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (convertToAlgorithmic == '\0') {
          ucnv_resetFromUnicode_63(cnv);
          outConverter = cnv;
          cnv = converter;
        }
        else {
          ucnv_resetToUnicode_63(cnv);
          outConverter = converter;
        }
        iVar1 = ucnv_internalConvert
                          (outConverter,cnv,target,targetCapacity,source,sourceLength,pErrorCode);
        ucnv_close_63(converter);
      }
    }
  }
  return iVar1;
}

Assistant:

static int32_t
ucnv_convertAlgorithmic(UBool convertToAlgorithmic,
                        UConverterType algorithmicType,
                        UConverter *cnv,
                        char *target, int32_t targetCapacity,
                        const char *source, int32_t sourceLength,
                        UErrorCode *pErrorCode) {
    UConverter algoConverterStatic; /* stack-allocated */
    UConverter *algoConverter, *to, *from;
    int32_t targetLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL || source==NULL || sourceLength<-1 ||
        targetCapacity<0 || (targetCapacity>0 && target==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* if there is no input data, we're done */
    if(sourceLength==0 || (sourceLength<0 && *source==0)) {
        return u_terminateChars(target, targetCapacity, 0, pErrorCode);
    }

    /* create the algorithmic converter */
    algoConverter=ucnv_createAlgorithmicConverter(&algoConverterStatic, algorithmicType,
                                                  "", 0, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* reset the other converter */
    if(convertToAlgorithmic) {
        /* cnv->Unicode->algo */
        ucnv_resetToUnicode(cnv);
        to=algoConverter;
        from=cnv;
    } else {
        /* algo->Unicode->cnv */
        ucnv_resetFromUnicode(cnv);
        from=algoConverter;
        to=cnv;
    }

    targetLength=ucnv_internalConvert(to, from,
                                      target, targetCapacity,
                                      source, sourceLength,
                                      pErrorCode);

    ucnv_close(algoConverter);

    return targetLength;
}